

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardCommon.cpp
# Opt level: O0

void leopard::xor_mem4(void *vx_0,void *vy_0,void *vx_1,void *vy_1,void *vx_2,void *vy_2,void *vx_3,
                      void *vy_3,uint64_t bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong *in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  __m128i x3_3_1;
  __m128i x0_3_2;
  __m128i x3_2_1;
  __m128i x2_2_1;
  __m128i x1_2_2;
  __m128i x0_2_2;
  __m128i x3_1_1;
  __m128i x2_1_1;
  __m128i x1_1_2;
  __m128i x0_1_2;
  __m128i x3_0_1;
  __m128i x2_0_1;
  __m128i x1_0_2;
  __m128i x0_0_2;
  __m128i *y16_3;
  __m128i *x16_3;
  __m128i *y16_2;
  __m128i *x16_2;
  __m128i *y16_1;
  __m128i *x16_1;
  __m128i *y16_0;
  __m128i *x16_0;
  __m256i x1_3_1;
  __m256i x0_3_1;
  __m256i x1_2_1;
  __m256i x0_2_1;
  __m256i x1_1_1;
  __m256i x0_1_1;
  __m256i x1_0_1;
  __m256i x0_0_1;
  __m256i x3_3;
  __m256i x2_3;
  __m256i x1_3;
  __m256i x0_3;
  __m256i x3_2;
  __m256i x2_2;
  __m256i x1_2;
  __m256i x0_2;
  __m256i x3_1;
  __m256i x2_1;
  __m256i x1_1;
  __m256i x0_1;
  __m256i x3_0;
  __m256i x2_0;
  __m256i x1_0;
  __m256i x0_0;
  __m256i *y32_3;
  __m256i *x32_3;
  __m256i *y32_2;
  __m256i *x32_2;
  __m256i *y32_1;
  __m256i *x32_1;
  __m256i *y32_0;
  __m256i *x32_0;
  ulong *local_1660;
  ulong *local_1658;
  ulong *local_1650;
  ulong *local_1648;
  ulong *local_1640;
  ulong *local_1638;
  ulong *local_1630;
  ulong *local_1628;
  ulong *local_1310;
  ulong *local_1308;
  ulong *local_1300;
  ulong *local_12f8;
  ulong *local_12f0;
  ulong *local_12e8;
  ulong *local_12e0;
  ulong *local_12d8;
  
  if ((CpuHasAVX2 & 1) == 0) {
    local_1658 = (ulong *)x3_3_1[1];
    local_1660 = (ulong *)vx_3;
    local_1650 = in_R9;
    local_1648 = in_R8;
    local_1640 = in_RCX;
    local_1638 = in_RDX;
    local_1630 = in_RSI;
    local_1628 = in_RDI;
    do {
      uVar1 = local_1630[1];
      uVar2 = local_1630[2];
      uVar3 = local_1630[3];
      uVar4 = local_1630[4];
      uVar5 = local_1630[5];
      uVar6 = local_1630[6];
      uVar7 = local_1630[7];
      *local_1628 = *local_1628 ^ *local_1630;
      local_1628[1] = local_1628[1] ^ uVar1;
      local_1628[2] = local_1628[2] ^ uVar2;
      local_1628[3] = local_1628[3] ^ uVar3;
      local_1628[4] = local_1628[4] ^ uVar4;
      local_1628[5] = local_1628[5] ^ uVar5;
      local_1628[6] = local_1628[6] ^ uVar6;
      local_1628[7] = local_1628[7] ^ uVar7;
      local_1628 = local_1628 + 8;
      local_1630 = local_1630 + 8;
      uVar1 = local_1640[1];
      uVar2 = local_1640[2];
      uVar3 = local_1640[3];
      uVar4 = local_1640[4];
      uVar5 = local_1640[5];
      uVar6 = local_1640[6];
      uVar7 = local_1640[7];
      *local_1638 = *local_1638 ^ *local_1640;
      local_1638[1] = local_1638[1] ^ uVar1;
      local_1638[2] = local_1638[2] ^ uVar2;
      local_1638[3] = local_1638[3] ^ uVar3;
      local_1638[4] = local_1638[4] ^ uVar4;
      local_1638[5] = local_1638[5] ^ uVar5;
      local_1638[6] = local_1638[6] ^ uVar6;
      local_1638[7] = local_1638[7] ^ uVar7;
      local_1638 = local_1638 + 8;
      local_1640 = local_1640 + 8;
      uVar1 = local_1650[1];
      uVar2 = local_1650[2];
      uVar3 = local_1650[3];
      uVar4 = local_1650[4];
      uVar5 = local_1650[5];
      uVar6 = local_1650[6];
      uVar7 = local_1650[7];
      *local_1648 = *local_1648 ^ *local_1650;
      local_1648[1] = local_1648[1] ^ uVar1;
      local_1648[2] = local_1648[2] ^ uVar2;
      local_1648[3] = local_1648[3] ^ uVar3;
      local_1648[4] = local_1648[4] ^ uVar4;
      local_1648[5] = local_1648[5] ^ uVar5;
      local_1648[6] = local_1648[6] ^ uVar6;
      local_1648[7] = local_1648[7] ^ uVar7;
      local_1648 = local_1648 + 8;
      local_1650 = local_1650 + 8;
      uVar1 = local_1660[1];
      uVar2 = local_1660[2];
      uVar3 = local_1660[3];
      uVar4 = local_1660[4];
      uVar5 = local_1660[5];
      uVar6 = local_1660[6];
      uVar7 = local_1660[7];
      *local_1658 = *local_1658 ^ *local_1660;
      local_1658[1] = local_1658[1] ^ uVar1;
      local_1658[2] = local_1658[2] ^ uVar2;
      local_1658[3] = local_1658[3] ^ uVar3;
      local_1658[4] = local_1658[4] ^ uVar4;
      local_1658[5] = local_1658[5] ^ uVar5;
      local_1658[6] = local_1658[6] ^ uVar6;
      local_1658[7] = local_1658[7] ^ uVar7;
      local_1658 = local_1658 + 8;
      local_1660 = local_1660 + 8;
      vy_3 = (void *)((long)vy_3 + -0x40);
    } while (vy_3 != (void *)0x0);
  }
  else {
    local_1308 = (ulong *)x3_3_1[1];
    local_1310 = (ulong *)vx_3;
    local_1300 = in_R9;
    local_12f8 = in_R8;
    local_12f0 = in_RCX;
    local_12e8 = in_RDX;
    local_12e0 = in_RSI;
    local_12d8 = in_RDI;
    for (; (void *)0x7f < vy_3; vy_3 = (void *)((long)vy_3 + -0x80)) {
      uVar1 = local_12e0[1];
      uVar2 = local_12e0[2];
      uVar3 = local_12e0[3];
      uVar4 = local_12e0[4];
      uVar5 = local_12e0[5];
      uVar6 = local_12e0[6];
      uVar7 = local_12e0[7];
      uVar8 = local_12e0[8];
      uVar9 = local_12e0[9];
      uVar10 = local_12e0[10];
      uVar11 = local_12e0[0xb];
      uVar12 = local_12e0[0xc];
      uVar13 = local_12e0[0xd];
      uVar14 = local_12e0[0xe];
      uVar15 = local_12e0[0xf];
      *local_12d8 = *local_12d8 ^ *local_12e0;
      local_12d8[1] = local_12d8[1] ^ uVar1;
      local_12d8[2] = local_12d8[2] ^ uVar2;
      local_12d8[3] = local_12d8[3] ^ uVar3;
      local_12d8[4] = local_12d8[4] ^ uVar4;
      local_12d8[5] = local_12d8[5] ^ uVar5;
      local_12d8[6] = local_12d8[6] ^ uVar6;
      local_12d8[7] = local_12d8[7] ^ uVar7;
      local_12d8[8] = local_12d8[8] ^ uVar8;
      local_12d8[9] = local_12d8[9] ^ uVar9;
      local_12d8[10] = local_12d8[10] ^ uVar10;
      local_12d8[0xb] = local_12d8[0xb] ^ uVar11;
      local_12d8[0xc] = local_12d8[0xc] ^ uVar12;
      local_12d8[0xd] = local_12d8[0xd] ^ uVar13;
      local_12d8[0xe] = local_12d8[0xe] ^ uVar14;
      local_12d8[0xf] = local_12d8[0xf] ^ uVar15;
      local_12d8 = local_12d8 + 0x10;
      local_12e0 = local_12e0 + 0x10;
      uVar1 = local_12f0[1];
      uVar2 = local_12f0[2];
      uVar3 = local_12f0[3];
      uVar4 = local_12f0[4];
      uVar5 = local_12f0[5];
      uVar6 = local_12f0[6];
      uVar7 = local_12f0[7];
      uVar8 = local_12f0[8];
      uVar9 = local_12f0[9];
      uVar10 = local_12f0[10];
      uVar11 = local_12f0[0xb];
      uVar12 = local_12f0[0xc];
      uVar13 = local_12f0[0xd];
      uVar14 = local_12f0[0xe];
      uVar15 = local_12f0[0xf];
      *local_12e8 = *local_12e8 ^ *local_12f0;
      local_12e8[1] = local_12e8[1] ^ uVar1;
      local_12e8[2] = local_12e8[2] ^ uVar2;
      local_12e8[3] = local_12e8[3] ^ uVar3;
      local_12e8[4] = local_12e8[4] ^ uVar4;
      local_12e8[5] = local_12e8[5] ^ uVar5;
      local_12e8[6] = local_12e8[6] ^ uVar6;
      local_12e8[7] = local_12e8[7] ^ uVar7;
      local_12e8[8] = local_12e8[8] ^ uVar8;
      local_12e8[9] = local_12e8[9] ^ uVar9;
      local_12e8[10] = local_12e8[10] ^ uVar10;
      local_12e8[0xb] = local_12e8[0xb] ^ uVar11;
      local_12e8[0xc] = local_12e8[0xc] ^ uVar12;
      local_12e8[0xd] = local_12e8[0xd] ^ uVar13;
      local_12e8[0xe] = local_12e8[0xe] ^ uVar14;
      local_12e8[0xf] = local_12e8[0xf] ^ uVar15;
      local_12e8 = local_12e8 + 0x10;
      local_12f0 = local_12f0 + 0x10;
      uVar1 = local_1300[1];
      uVar2 = local_1300[2];
      uVar3 = local_1300[3];
      uVar4 = local_1300[4];
      uVar5 = local_1300[5];
      uVar6 = local_1300[6];
      uVar7 = local_1300[7];
      uVar8 = local_1300[8];
      uVar9 = local_1300[9];
      uVar10 = local_1300[10];
      uVar11 = local_1300[0xb];
      uVar12 = local_1300[0xc];
      uVar13 = local_1300[0xd];
      uVar14 = local_1300[0xe];
      uVar15 = local_1300[0xf];
      *local_12f8 = *local_12f8 ^ *local_1300;
      local_12f8[1] = local_12f8[1] ^ uVar1;
      local_12f8[2] = local_12f8[2] ^ uVar2;
      local_12f8[3] = local_12f8[3] ^ uVar3;
      local_12f8[4] = local_12f8[4] ^ uVar4;
      local_12f8[5] = local_12f8[5] ^ uVar5;
      local_12f8[6] = local_12f8[6] ^ uVar6;
      local_12f8[7] = local_12f8[7] ^ uVar7;
      local_12f8[8] = local_12f8[8] ^ uVar8;
      local_12f8[9] = local_12f8[9] ^ uVar9;
      local_12f8[10] = local_12f8[10] ^ uVar10;
      local_12f8[0xb] = local_12f8[0xb] ^ uVar11;
      local_12f8[0xc] = local_12f8[0xc] ^ uVar12;
      local_12f8[0xd] = local_12f8[0xd] ^ uVar13;
      local_12f8[0xe] = local_12f8[0xe] ^ uVar14;
      local_12f8[0xf] = local_12f8[0xf] ^ uVar15;
      local_12f8 = local_12f8 + 0x10;
      local_1300 = local_1300 + 0x10;
      uVar1 = local_1310[1];
      uVar2 = local_1310[2];
      uVar3 = local_1310[3];
      uVar4 = local_1310[4];
      uVar5 = local_1310[5];
      uVar6 = local_1310[6];
      uVar7 = local_1310[7];
      uVar8 = local_1310[8];
      uVar9 = local_1310[9];
      uVar10 = local_1310[10];
      uVar11 = local_1310[0xb];
      uVar12 = local_1310[0xc];
      uVar13 = local_1310[0xd];
      uVar14 = local_1310[0xe];
      uVar15 = local_1310[0xf];
      *local_1308 = *local_1308 ^ *local_1310;
      local_1308[1] = local_1308[1] ^ uVar1;
      local_1308[2] = local_1308[2] ^ uVar2;
      local_1308[3] = local_1308[3] ^ uVar3;
      local_1308[4] = local_1308[4] ^ uVar4;
      local_1308[5] = local_1308[5] ^ uVar5;
      local_1308[6] = local_1308[6] ^ uVar6;
      local_1308[7] = local_1308[7] ^ uVar7;
      local_1308[8] = local_1308[8] ^ uVar8;
      local_1308[9] = local_1308[9] ^ uVar9;
      local_1308[10] = local_1308[10] ^ uVar10;
      local_1308[0xb] = local_1308[0xb] ^ uVar11;
      local_1308[0xc] = local_1308[0xc] ^ uVar12;
      local_1308[0xd] = local_1308[0xd] ^ uVar13;
      local_1308[0xe] = local_1308[0xe] ^ uVar14;
      local_1308[0xf] = local_1308[0xf] ^ uVar15;
      local_1308 = local_1308 + 0x10;
      local_1310 = local_1310 + 0x10;
    }
    if (vy_3 != (void *)0x0) {
      uVar1 = local_12e0[1];
      uVar2 = local_12e0[2];
      uVar3 = local_12e0[3];
      uVar4 = local_12e0[4];
      uVar5 = local_12e0[5];
      uVar6 = local_12e0[6];
      uVar7 = local_12e0[7];
      uVar8 = *local_12e8;
      uVar9 = local_12e8[1];
      uVar10 = local_12e8[2];
      uVar11 = local_12e8[3];
      uVar12 = *local_12f0;
      uVar13 = local_12f0[1];
      uVar14 = local_12f0[2];
      uVar15 = local_12f0[3];
      uVar16 = local_12e8[4];
      uVar17 = local_12e8[5];
      uVar18 = local_12e8[6];
      uVar19 = local_12e8[7];
      uVar20 = local_12f0[4];
      uVar21 = local_12f0[5];
      uVar22 = local_12f0[6];
      uVar23 = local_12f0[7];
      *local_12d8 = *local_12d8 ^ *local_12e0;
      local_12d8[1] = local_12d8[1] ^ uVar1;
      local_12d8[2] = local_12d8[2] ^ uVar2;
      local_12d8[3] = local_12d8[3] ^ uVar3;
      local_12d8[4] = local_12d8[4] ^ uVar4;
      local_12d8[5] = local_12d8[5] ^ uVar5;
      local_12d8[6] = local_12d8[6] ^ uVar6;
      local_12d8[7] = local_12d8[7] ^ uVar7;
      *local_12e8 = uVar8 ^ uVar12;
      local_12e8[1] = uVar9 ^ uVar13;
      local_12e8[2] = uVar10 ^ uVar14;
      local_12e8[3] = uVar11 ^ uVar15;
      local_12e8[4] = uVar16 ^ uVar20;
      local_12e8[5] = uVar17 ^ uVar21;
      local_12e8[6] = uVar18 ^ uVar22;
      local_12e8[7] = uVar19 ^ uVar23;
      uVar1 = local_1300[1];
      uVar2 = local_1300[2];
      uVar3 = local_1300[3];
      uVar4 = local_1300[4];
      uVar5 = local_1300[5];
      uVar6 = local_1300[6];
      uVar7 = local_1300[7];
      uVar8 = *local_1308;
      uVar9 = local_1308[1];
      uVar10 = local_1308[2];
      uVar11 = local_1308[3];
      uVar12 = *local_1310;
      uVar13 = local_1310[1];
      uVar14 = local_1310[2];
      uVar15 = local_1310[3];
      uVar16 = local_1308[4];
      uVar17 = local_1308[5];
      uVar18 = local_1308[6];
      uVar19 = local_1308[7];
      uVar20 = local_1310[4];
      uVar21 = local_1310[5];
      uVar22 = local_1310[6];
      uVar23 = local_1310[7];
      *local_12f8 = *local_12f8 ^ *local_1300;
      local_12f8[1] = local_12f8[1] ^ uVar1;
      local_12f8[2] = local_12f8[2] ^ uVar2;
      local_12f8[3] = local_12f8[3] ^ uVar3;
      local_12f8[4] = local_12f8[4] ^ uVar4;
      local_12f8[5] = local_12f8[5] ^ uVar5;
      local_12f8[6] = local_12f8[6] ^ uVar6;
      local_12f8[7] = local_12f8[7] ^ uVar7;
      *local_1308 = uVar8 ^ uVar12;
      local_1308[1] = uVar9 ^ uVar13;
      local_1308[2] = uVar10 ^ uVar14;
      local_1308[3] = uVar11 ^ uVar15;
      local_1308[4] = uVar16 ^ uVar20;
      local_1308[5] = uVar17 ^ uVar21;
      local_1308[6] = uVar18 ^ uVar22;
      local_1308[7] = uVar19 ^ uVar23;
    }
  }
  return;
}

Assistant:

void xor_mem4(
    void * LEO_RESTRICT vx_0, const void * LEO_RESTRICT vy_0,
    void * LEO_RESTRICT vx_1, const void * LEO_RESTRICT vy_1,
    void * LEO_RESTRICT vx_2, const void * LEO_RESTRICT vy_2,
    void * LEO_RESTRICT vx_3, const void * LEO_RESTRICT vy_3,
    uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_M256 * LEO_RESTRICT       x32_0 = reinterpret_cast<LEO_M256 *>      (vx_0);
        const LEO_M256 * LEO_RESTRICT y32_0 = reinterpret_cast<const LEO_M256 *>(vy_0);
        LEO_M256 * LEO_RESTRICT       x32_1 = reinterpret_cast<LEO_M256 *>      (vx_1);
        const LEO_M256 * LEO_RESTRICT y32_1 = reinterpret_cast<const LEO_M256 *>(vy_1);
        LEO_M256 * LEO_RESTRICT       x32_2 = reinterpret_cast<LEO_M256 *>      (vx_2);
        const LEO_M256 * LEO_RESTRICT y32_2 = reinterpret_cast<const LEO_M256 *>(vy_2);
        LEO_M256 * LEO_RESTRICT       x32_3 = reinterpret_cast<LEO_M256 *>      (vx_3);
        const LEO_M256 * LEO_RESTRICT y32_3 = reinterpret_cast<const LEO_M256 *>(vy_3);
        while (bytes >= 128)
        {
            const LEO_M256 x0_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0),     _mm256_loadu_si256(y32_0));
            const LEO_M256 x1_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0 + 1), _mm256_loadu_si256(y32_0 + 1));
            const LEO_M256 x2_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0 + 2), _mm256_loadu_si256(y32_0 + 2));
            const LEO_M256 x3_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0 + 3), _mm256_loadu_si256(y32_0 + 3));
            _mm256_storeu_si256(x32_0, x0_0);
            _mm256_storeu_si256(x32_0 + 1, x1_0);
            _mm256_storeu_si256(x32_0 + 2, x2_0);
            _mm256_storeu_si256(x32_0 + 3, x3_0);
            x32_0 += 4, y32_0 += 4;
            const LEO_M256 x0_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1),     _mm256_loadu_si256(y32_1));
            const LEO_M256 x1_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1 + 1), _mm256_loadu_si256(y32_1 + 1));
            const LEO_M256 x2_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1 + 2), _mm256_loadu_si256(y32_1 + 2));
            const LEO_M256 x3_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1 + 3), _mm256_loadu_si256(y32_1 + 3));
            _mm256_storeu_si256(x32_1, x0_1);
            _mm256_storeu_si256(x32_1 + 1, x1_1);
            _mm256_storeu_si256(x32_1 + 2, x2_1);
            _mm256_storeu_si256(x32_1 + 3, x3_1);
            x32_1 += 4, y32_1 += 4;
            const LEO_M256 x0_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2),     _mm256_loadu_si256(y32_2));
            const LEO_M256 x1_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2 + 1), _mm256_loadu_si256(y32_2 + 1));
            const LEO_M256 x2_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2 + 2), _mm256_loadu_si256(y32_2 + 2));
            const LEO_M256 x3_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2 + 3), _mm256_loadu_si256(y32_2 + 3));
            _mm256_storeu_si256(x32_2, x0_2);
            _mm256_storeu_si256(x32_2 + 1, x1_2);
            _mm256_storeu_si256(x32_2 + 2, x2_2);
            _mm256_storeu_si256(x32_2 + 3, x3_2);
            x32_2 += 4, y32_2 += 4;
            const LEO_M256 x0_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3),     _mm256_loadu_si256(y32_3));
            const LEO_M256 x1_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3 + 1), _mm256_loadu_si256(y32_3 + 1));
            const LEO_M256 x2_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3 + 2), _mm256_loadu_si256(y32_3 + 2));
            const LEO_M256 x3_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3 + 3), _mm256_loadu_si256(y32_3 + 3));
            _mm256_storeu_si256(x32_3,     x0_3);
            _mm256_storeu_si256(x32_3 + 1, x1_3);
            _mm256_storeu_si256(x32_3 + 2, x2_3);
            _mm256_storeu_si256(x32_3 + 3, x3_3);
            x32_3 += 4, y32_3 += 4;
            bytes -= 128;
        }
        if (bytes > 0)
        {
            const LEO_M256 x0_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0),     _mm256_loadu_si256(y32_0));
            const LEO_M256 x1_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0 + 1), _mm256_loadu_si256(y32_0 + 1));
            const LEO_M256 x0_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1),     _mm256_loadu_si256(y32_1));
            const LEO_M256 x1_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1 + 1), _mm256_loadu_si256(y32_1 + 1));
            _mm256_storeu_si256(x32_0, x0_0);
            _mm256_storeu_si256(x32_0 + 1, x1_0);
            _mm256_storeu_si256(x32_1, x0_1);
            _mm256_storeu_si256(x32_1 + 1, x1_1);
            const LEO_M256 x0_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2),     _mm256_loadu_si256(y32_2));
            const LEO_M256 x1_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2 + 1), _mm256_loadu_si256(y32_2 + 1));
            const LEO_M256 x0_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3),     _mm256_loadu_si256(y32_3));
            const LEO_M256 x1_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3 + 1), _mm256_loadu_si256(y32_3 + 1));
            _mm256_storeu_si256(x32_2,     x0_2);
            _mm256_storeu_si256(x32_2 + 1, x1_2);
            _mm256_storeu_si256(x32_3,     x0_3);
            _mm256_storeu_si256(x32_3 + 1, x1_3);
        }
        return;
    }
#endif // LEO_TRY_AVX2
    LEO_M128 * LEO_RESTRICT       x16_0 = reinterpret_cast<LEO_M128 *>      (vx_0);
    const LEO_M128 * LEO_RESTRICT y16_0 = reinterpret_cast<const LEO_M128 *>(vy_0);
    LEO_M128 * LEO_RESTRICT       x16_1 = reinterpret_cast<LEO_M128 *>      (vx_1);
    const LEO_M128 * LEO_RESTRICT y16_1 = reinterpret_cast<const LEO_M128 *>(vy_1);
    LEO_M128 * LEO_RESTRICT       x16_2 = reinterpret_cast<LEO_M128 *>      (vx_2);
    const LEO_M128 * LEO_RESTRICT y16_2 = reinterpret_cast<const LEO_M128 *>(vy_2);
    LEO_M128 * LEO_RESTRICT       x16_3 = reinterpret_cast<LEO_M128 *>      (vx_3);
    const LEO_M128 * LEO_RESTRICT y16_3 = reinterpret_cast<const LEO_M128 *>(vy_3);
    do
    {
        const LEO_M128 x0_0 = _mm_xor_si128(_mm_loadu_si128(x16_0),     _mm_loadu_si128(y16_0));
        const LEO_M128 x1_0 = _mm_xor_si128(_mm_loadu_si128(x16_0 + 1), _mm_loadu_si128(y16_0 + 1));
        const LEO_M128 x2_0 = _mm_xor_si128(_mm_loadu_si128(x16_0 + 2), _mm_loadu_si128(y16_0 + 2));
        const LEO_M128 x3_0 = _mm_xor_si128(_mm_loadu_si128(x16_0 + 3), _mm_loadu_si128(y16_0 + 3));
        _mm_storeu_si128(x16_0, x0_0);
        _mm_storeu_si128(x16_0 + 1, x1_0);
        _mm_storeu_si128(x16_0 + 2, x2_0);
        _mm_storeu_si128(x16_0 + 3, x3_0);
        x16_0 += 4, y16_0 += 4;
        const LEO_M128 x0_1 = _mm_xor_si128(_mm_loadu_si128(x16_1),     _mm_loadu_si128(y16_1));
        const LEO_M128 x1_1 = _mm_xor_si128(_mm_loadu_si128(x16_1 + 1), _mm_loadu_si128(y16_1 + 1));
        const LEO_M128 x2_1 = _mm_xor_si128(_mm_loadu_si128(x16_1 + 2), _mm_loadu_si128(y16_1 + 2));
        const LEO_M128 x3_1 = _mm_xor_si128(_mm_loadu_si128(x16_1 + 3), _mm_loadu_si128(y16_1 + 3));
        _mm_storeu_si128(x16_1, x0_1);
        _mm_storeu_si128(x16_1 + 1, x1_1);
        _mm_storeu_si128(x16_1 + 2, x2_1);
        _mm_storeu_si128(x16_1 + 3, x3_1);
        x16_1 += 4, y16_1 += 4;
        const LEO_M128 x0_2 = _mm_xor_si128(_mm_loadu_si128(x16_2),     _mm_loadu_si128(y16_2));
        const LEO_M128 x1_2 = _mm_xor_si128(_mm_loadu_si128(x16_2 + 1), _mm_loadu_si128(y16_2 + 1));
        const LEO_M128 x2_2 = _mm_xor_si128(_mm_loadu_si128(x16_2 + 2), _mm_loadu_si128(y16_2 + 2));
        const LEO_M128 x3_2 = _mm_xor_si128(_mm_loadu_si128(x16_2 + 3), _mm_loadu_si128(y16_2 + 3));
        _mm_storeu_si128(x16_2, x0_2);
        _mm_storeu_si128(x16_2 + 1, x1_2);
        _mm_storeu_si128(x16_2 + 2, x2_2);
        _mm_storeu_si128(x16_2 + 3, x3_2);
        x16_2 += 4, y16_2 += 4;
        const LEO_M128 x0_3 = _mm_xor_si128(_mm_loadu_si128(x16_3),     _mm_loadu_si128(y16_3));
        const LEO_M128 x1_3 = _mm_xor_si128(_mm_loadu_si128(x16_3 + 1), _mm_loadu_si128(y16_3 + 1));
        const LEO_M128 x2_3 = _mm_xor_si128(_mm_loadu_si128(x16_3 + 2), _mm_loadu_si128(y16_3 + 2));
        const LEO_M128 x3_3 = _mm_xor_si128(_mm_loadu_si128(x16_3 + 3), _mm_loadu_si128(y16_3 + 3));
        _mm_storeu_si128(x16_3,     x0_3);
        _mm_storeu_si128(x16_3 + 1, x1_3);
        _mm_storeu_si128(x16_3 + 2, x2_3);
        _mm_storeu_si128(x16_3 + 3, x3_3);
        x16_3 += 4, y16_3 += 4;
        bytes -= 64;
    } while (bytes > 0);
}